

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

size_t __thiscall asmjit::CodeHolder::getCodeSize(CodeHolder *this)

{
  CodeHolder *in_RDI;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  
  sync(in_RDI);
  if ((in_RDI->_sections).super_ZoneVectorBase._length == 0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  return *(long *)(*(in_RDI->_sections).super_ZoneVectorBase._data + 0x40) +
         (ulong)in_RDI->_trampolinesSize;
}

Assistant:

size_t CodeHolder::getCodeSize() const noexcept {
  // Reflect all changes first.
  const_cast<CodeHolder*>(this)->sync();

  // TODO: Support sections.
  return _sections[0]->_buffer._length + getTrampolinesSize();
}